

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependency_manager.cpp
# Opt level: O1

void __thiscall
duckdb::DependencyManager::DropObject
          (DependencyManager *this,CatalogTransaction transaction,CatalogEntry *object,bool cascade)

{
  CatalogType CVar1;
  __node_base _Var2;
  catalog_entry_set_t to_drop;
  optional_ptr<duckdb::CatalogSet,_true> local_60;
  _Hashtable<std::reference_wrapper<duckdb::CatalogEntry>,_std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>,_std::__detail::_Identity,_duckdb::CatalogEntryEquality,_duckdb::CatalogEntryHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_58;
  
  if (object->internal == false) {
    CVar1 = object->type;
    if (((CVar1 != DATABASE_ENTRY) && (CVar1 != RENAMED_ENTRY)) && (CVar1 != DEPENDENCY_ENTRY)) {
      CheckDropDependencies((catalog_entry_set_t *)&local_58,this,transaction,object,cascade);
      CleanupDependencies(this,transaction,object);
      if (local_58._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
        _Var2._M_nxt = local_58._M_before_begin._M_nxt;
        do {
          local_60.ptr = (CatalogSet *)_Var2._M_nxt[1]._M_nxt[3]._M_nxt;
          optional_ptr<duckdb::CatalogSet,_true>::CheckValid(&local_60);
          CatalogSet::DropEntry
                    (local_60.ptr,transaction,(string *)(_Var2._M_nxt[1]._M_nxt + 4),cascade,false);
          _Var2._M_nxt = (_Var2._M_nxt)->_M_nxt;
        } while (_Var2._M_nxt != (_Hash_node_base *)0x0);
      }
      ::std::
      _Hashtable<std::reference_wrapper<duckdb::CatalogEntry>,_std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>,_std::__detail::_Identity,_duckdb::CatalogEntryEquality,_duckdb::CatalogEntryHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&local_58);
    }
  }
  return;
}

Assistant:

bool DependencyManager::IsSystemEntry(CatalogEntry &entry) const {
	if (entry.internal) {
		return true;
	}

	switch (entry.type) {
	case CatalogType::DEPENDENCY_ENTRY:
	case CatalogType::DATABASE_ENTRY:
	case CatalogType::RENAMED_ENTRY:
		return true;
	default:
		return false;
	}
}